

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanPlainScalar(Scanner *this)

{
  bool bVar1;
  Stream *in_RDI;
  Mark MVar2;
  Token token;
  Mark mark;
  ScanScalarParams params;
  string scalar;
  ScanScalarParams *in_stack_00000190;
  Stream *in_stack_00000198;
  Scanner *in_stack_fffffffffffffeb8;
  value_type *__x;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int local_128;
  RegEx *local_118;
  string local_e0 [96];
  Mark local_80;
  Mark local_70;
  Scanner *in_stack_ffffffffffffffa0;
  ScanScalarParams local_58;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  ScanScalarParams::ScanScalarParams(&local_58);
  bVar1 = InFlowContext((Scanner *)0xf21652);
  if (bVar1) {
    local_118 = Exp::ScanScalarEndInFlow();
  }
  else {
    local_118 = Exp::ScanScalarEnd();
  }
  local_58.end = local_118;
  local_58.eatEnd = false;
  bVar1 = InFlowContext((Scanner *)0xf216b1);
  if (bVar1) {
    local_128 = 0;
  }
  else {
    in_stack_fffffffffffffed4 = GetTopIndent(in_stack_fffffffffffffeb8);
    local_128 = in_stack_fffffffffffffed4 + 1;
  }
  local_58.indent = local_128;
  local_58.fold = FOLD_FLOW;
  local_58.eatLeadingWhitespace = true;
  local_58.trimTrailingSpaces = true;
  local_58.chomp = STRIP;
  local_58.onDocIndicator = BREAK;
  local_58.onTabInIndentation = THROW;
  InsertPotentialSimpleKey(in_stack_ffffffffffffffa0);
  MVar2 = YAML::Stream::mark(in_RDI);
  local_80 = MVar2;
  local_70 = MVar2;
  ScanScalar_abi_cxx11_(in_stack_00000198,in_stack_00000190);
  __x = (value_type *)(local_e0 + 0x40);
  std::__cxx11::string::operator=(local_28,(string *)__x);
  std::__cxx11::string::~string((string *)__x);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a =
       local_58.leadingSpaces & 1;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),MVar2.line,
               (Mark *)CONCAT44(MVar2.column,in_stack_fffffffffffffec0));
  std::__cxx11::string::operator=(local_e0,local_28);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
             CONCAT44(MVar2.column,in_stack_fffffffffffffec0),__x);
  Token::~Token((Token *)CONCAT44(MVar2.column,in_stack_fffffffffffffec0));
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Scanner::ScanPlainScalar() {
  std::string scalar;

  // set up the scanning parameters
  ScanScalarParams params;
  params.end =
      (InFlowContext() ? &Exp::ScanScalarEndInFlow() : &Exp::ScanScalarEnd());
  params.eatEnd = false;
  params.indent = (InFlowContext() ? 0 : GetTopIndent() + 1);
  params.fold = FOLD_FLOW;
  params.eatLeadingWhitespace = true;
  params.trimTrailingSpaces = true;
  params.chomp = STRIP;
  params.onDocIndicator = BREAK;
  params.onTabInIndentation = THROW;

  // insert a potential simple key
  InsertPotentialSimpleKey();

  Mark mark = INPUT.mark();
  scalar = ScanScalar(INPUT, params);

  // can have a simple key only if we ended the scalar by starting a new line
  m_simpleKeyAllowed = params.leadingSpaces;
  m_canBeJSONFlow = false;

  // finally, check and see if we ended on an illegal character
  // if(Exp::IllegalCharInScalar.Matches(INPUT))
  //	throw ParserException(INPUT.mark(), ErrorMsg::CHAR_IN_SCALAR);

  Token token(Token::PLAIN_SCALAR, mark);
  token.value = scalar;
  m_tokens.push(token);
}